

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O3

void __thiscall
capnp::EzRpcServer::Impl::Impl
          (Impl *this,Client *mainInterface,sockaddr *bindAddress,uint addrSize,
          ReaderOptions readerOpts)

{
  _Rb_tree_header *p_Var1;
  Disposer *pDVar2;
  ForkHub<unsigned_int> *pFVar3;
  ClientHook *pCVar4;
  long *plVar5;
  PromiseNode *pPVar6;
  ConnectionReceiver *pCVar7;
  int iVar8;
  undefined4 extraout_var;
  ReaderOptions readerOpts_00;
  Own<kj::ConnectionReceiver> listener;
  undefined8 *local_78;
  long *plStack_70;
  Promise<unsigned_int> local_68;
  Own<kj::ConnectionReceiver> local_58;
  undefined8 *local_48;
  long *plStack_40;
  uint local_34;
  
  (this->super_SturdyRefRestorer<capnp::AnyPointer>).super_SturdyRefRestorerBase.
  _vptr_SturdyRefRestorerBase = (_func_int **)&PTR_baseRestore_00623f80;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_00623fa8;
  pCVar4 = (mainInterface->hook).ptr;
  (this->mainInterface).hook.disposer = (mainInterface->hook).disposer;
  (this->mainInterface).hook.ptr = pCVar4;
  (mainInterface->hook).ptr = (ClientHook *)0x0;
  EzRpcContext::getThreadLocal();
  p_Var1 = &(this->exportMap)._M_t._M_impl.super__Rb_tree_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->portPromise).hub.disposer = (Disposer *)0x0;
  (this->portPromise).hub.ptr = (ForkHub<unsigned_int> *)0x0;
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler);
  iVar8 = (*((((this->context).ptr)->ioContext).provider.ptr)->_vptr_AsyncIoProvider[3])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 8))
            (&local_78,(long *)CONCAT44(extraout_var,iVar8),bindAddress,addrSize);
  (**(code **)(*plStack_70 + 8))(&local_58);
  plVar5 = plStack_70;
  if (plStack_70 != (long *)0x0) {
    plStack_70 = (long *)0x0;
    (**(code **)*local_78)(local_78,(long)plVar5 + *(long *)(*plVar5 + -0x10));
  }
  local_34 = (*(local_58.ptr)->_vptr_ConnectionReceiver[1])();
  kj::heap<kj::_::ImmediatePromiseNode<unsigned_int>,unsigned_int>((kj *)&local_78,&local_34);
  local_48 = local_78;
  plStack_40 = plStack_70;
  kj::Promise<unsigned_int>::fork(&local_68);
  pDVar2 = (this->portPromise).hub.disposer;
  pFVar3 = (this->portPromise).hub.ptr;
  *(undefined4 *)&(this->portPromise).hub.disposer = local_68.super_PromiseBase.node.disposer._0_4_;
  *(undefined4 *)((long)&(this->portPromise).hub.disposer + 4) =
       local_68.super_PromiseBase.node.disposer._4_4_;
  *(undefined4 *)&(this->portPromise).hub.ptr = local_68.super_PromiseBase.node.ptr._0_4_;
  *(undefined4 *)((long)&(this->portPromise).hub.ptr + 4) =
       local_68.super_PromiseBase.node.ptr._4_4_;
  local_68.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  if (pFVar3 != (ForkHub<unsigned_int> *)0x0) {
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pFVar3->super_ForkHubBase).super_Refcounted.super_Disposer.
                              _vptr_Disposer +
                      (long)(pFVar3->super_ForkHubBase).super_Refcounted.super_Disposer.
                            _vptr_Disposer[-2]));
    pPVar6 = local_68.super_PromiseBase.node.ptr;
    if (local_68.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_68.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (*(code *)**(undefined8 **)
                  CONCAT44(local_68.super_PromiseBase.node.disposer._4_4_,
                           local_68.super_PromiseBase.node.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(local_68.super_PromiseBase.node.disposer._4_4_,
                          local_68.super_PromiseBase.node.disposer._0_4_),
                 (_func_int *)
                 ((long)&pPVar6->_vptr_PromiseNode + (long)pPVar6->_vptr_PromiseNode[-2]));
    }
  }
  plVar5 = plStack_40;
  if (plStack_40 != (long *)0x0) {
    plStack_40 = (long *)0x0;
    (**(code **)*local_48)(local_48,(long)plVar5 + *(long *)(*plVar5 + -0x10));
  }
  readerOpts_00._8_8_ = readerOpts._8_8_ & 0xffffffff;
  readerOpts_00.traversalLimitInWords = readerOpts.traversalLimitInWords;
  acceptLoop(this,&local_58,readerOpts_00);
  pCVar7 = local_58.ptr;
  if (local_58.ptr != (ConnectionReceiver *)0x0) {
    local_58.ptr = (ConnectionReceiver *)0x0;
    (**(local_58.disposer)->_vptr_Disposer)
              (local_58.disposer,
               (_func_int *)
               ((long)&pCVar7->_vptr_ConnectionReceiver + (long)pCVar7->_vptr_ConnectionReceiver[-2]
               ));
  }
  return;
}

Assistant:

Impl(Capability::Client mainInterface, struct sockaddr* bindAddress, uint addrSize,
       ReaderOptions readerOpts)
      : mainInterface(kj::mv(mainInterface)),
        context(EzRpcContext::getThreadLocal()), portPromise(nullptr), tasks(*this) {
    auto listener = context->getIoProvider().getNetwork()
        .getSockaddr(bindAddress, addrSize)->listen();
    portPromise = kj::Promise<uint>(listener->getPort()).fork();
    acceptLoop(kj::mv(listener), readerOpts);
  }